

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O2

void __thiscall
Diligent::ShaderVariableManagerGL::CheckResources
          (ShaderVariableManagerGL *this,IResourceMapping *pResourceMapping,
          BIND_SHADER_RESOURCES_FLAGS Flags,SHADER_RESOURCE_VARIABLE_TYPE_FLAGS *StaleVarTypes)

{
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *this_00;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *this_01;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *this_02;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *this_03;
  BIND_SHADER_RESOURCES_FLAGS Flags_00;
  Uint32 ub;
  uint uVar1;
  uint uVar2;
  
  Flags_00 = Flags | BIND_SHADER_RESOURCES_UPDATE_ALL;
  if ((Flags & BIND_SHADER_RESOURCES_UPDATE_ALL) != 0) {
    Flags_00 = Flags;
  }
  uVar2 = (uint)(((this->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                 m_ResourceCache)->m_ContentType == SRB) * 5 + 1;
  uVar1 = 0;
  do {
    if (this->m_TextureOffset / 0x18 <= uVar1) {
      uVar1 = 0;
      do {
        if ((uint)(((ulong)this->m_ImageOffset - (ulong)this->m_TextureOffset) / 0x18) <= uVar1) {
          uVar1 = 0;
          do {
            if ((uint)(((ulong)this->m_StorageBufferOffset - (ulong)this->m_ImageOffset) / 0x18) <=
                uVar1) {
              uVar1 = 0;
              do {
                if ((uint)(((ulong)this->m_VariableEndOffset - (ulong)this->m_StorageBufferOffset) /
                          0x18) <= uVar1) {
                  return;
                }
                this_03 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                           *)GetConstResource<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                                       (this,uVar1);
                ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                ::CheckResources(this_03,pResourceMapping,Flags_00,StaleVarTypes);
                uVar1 = uVar1 + 1;
              } while ((uVar2 & ~*StaleVarTypes) != 0);
              return;
            }
            this_02 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                       *)GetConstResource<Diligent::ShaderVariableManagerGL::ImageBindInfo>
                                   (this,uVar1);
            ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
            ::CheckResources(this_02,pResourceMapping,Flags_00,StaleVarTypes);
            uVar1 = uVar1 + 1;
          } while ((uVar2 & ~*StaleVarTypes) != 0);
          return;
        }
        this_01 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                   *)GetConstResource<Diligent::ShaderVariableManagerGL::TextureBindInfo>
                               (this,uVar1);
        ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
        ::CheckResources(this_01,pResourceMapping,Flags_00,StaleVarTypes);
        uVar1 = uVar1 + 1;
      } while ((uVar2 & ~*StaleVarTypes) != 0);
      return;
    }
    this_00 = (ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
               *)GetConstResource<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo>
                           (this,uVar1);
    ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
    ::CheckResources(this_00,pResourceMapping,Flags_00,StaleVarTypes);
    uVar1 = uVar1 + 1;
  } while ((uVar2 & ~*StaleVarTypes) != 0);
  return;
}

Assistant:

void ShaderVariableManagerGL::CheckResources(IResourceMapping*                    pResourceMapping,
                                             BIND_SHADER_RESOURCES_FLAGS          Flags,
                                             SHADER_RESOURCE_VARIABLE_TYPE_FLAGS& StaleVarTypes) const
{
    if ((Flags & BIND_SHADER_RESOURCES_UPDATE_ALL) == 0)
        Flags |= BIND_SHADER_RESOURCES_UPDATE_ALL;

    const auto AllowedTypes = m_ResourceCache.GetContentType() == ResourceCacheContentType::SRB ?
        SHADER_RESOURCE_VARIABLE_TYPE_FLAG_MUT_DYN :
        SHADER_RESOURCE_VARIABLE_TYPE_FLAG_STATIC;

    HandleConstResources(
        [&](const UniformBuffBindInfo& ub) {
            ub.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        },
        [&](const TextureBindInfo& tex) {
            tex.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        },
        [&](const ImageBindInfo& img) {
            img.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        },
        [&](const StorageBufferBindInfo& ssbo) {
            ssbo.CheckResources(pResourceMapping, Flags, StaleVarTypes);
            return (StaleVarTypes & AllowedTypes) != AllowedTypes;
        });
}